

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O3

DOMNode * __thiscall xercesc_4_0::DOMAttrMapImpl::setNamedItem(DOMAttrMapImpl *this,DOMNode *arg)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  DOMDocument *doc;
  long *plVar5;
  long lVar6;
  DOMNodeImpl *this_00;
  DOMDocument *pDVar7;
  DOMException *this_01;
  undefined4 extraout_var_00;
  DOMNodeVector *pDVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  DOMNode *pDVar9;
  ulong index;
  DOMNode *pDVar10;
  MemoryManager **ppMVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  
  iVar3 = (*arg->_vptr_DOMNode[4])(arg);
  if (iVar3 == 2) {
    iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
    doc = (DOMDocument *)CONCAT44(extraout_var,iVar3);
    plVar5 = (long *)__dynamic_cast(arg,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
    if ((plVar5 == (long *)0x0) || (lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5), lVar6 == 0)) {
      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
    }
    else {
      this_00 = (DOMNodeImpl *)(**(code **)(*plVar5 + 0x10))(plVar5);
      pDVar7 = DOMNodeImpl::getOwnerDocument(this_00);
      if (pDVar7 == doc) {
        bVar1 = readOnly(this);
        if (!bVar1) {
          iVar3 = (*arg->_vptr_DOMNode[4])(arg);
          if (iVar3 == 2) {
            pDVar9 = this->fOwnerNode;
            uVar2 = (ushort)*(uint *)&this_00->flags;
            if (((*(uint *)&this_00->flags & 8) != 0) && (this_00->fOwnerNode != pDVar9)) {
              this_01 = (DOMException *)__cxa_allocate_exception(0x28);
              ppMVar11 = &XMLPlatformUtils::fgMemoryManager;
              if ((this->fOwnerNode != (DOMNode *)0x0) &&
                 (iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(),
                 CONCAT44(extraout_var_08,iVar3) != 0)) {
                iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
                ppMVar11 = (MemoryManager **)(CONCAT44(extraout_var_09,iVar3) + 0x158);
              }
              DOMException::DOMException(this_01,10,0,*ppMVar11);
              goto LAB_0025b1a9;
            }
          }
          else {
            pDVar9 = this->fOwnerNode;
            uVar2 = this_00->flags;
          }
          this_00->fOwnerNode = pDVar9;
          this_00->flags = uVar2 | 8;
          iVar3 = (*arg->_vptr_DOMNode[2])(arg);
          uVar4 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xe])
                            (this,CONCAT44(extraout_var_00,iVar3));
          if ((int)uVar4 < 0) {
            pDVar8 = this->fNodes;
            if (pDVar8 == (DOMNodeVector *)0x0) {
              pDVar9 = &doc[-1].super_DOMNode;
              if (doc == (DOMDocument *)0x0) {
                pDVar9 = (DOMNode *)0x0;
              }
              iVar3 = (*pDVar9->_vptr_DOMNode[4])(pDVar9,0x18);
              pDVar8 = (DOMNodeVector *)CONCAT44(extraout_var_01,iVar3);
              DOMNodeVector::DOMNodeVector(pDVar8,doc);
              this->fNodes = pDVar8;
            }
            DOMNodeVector::insertElementAt(pDVar8,arg,(ulong)~uVar4);
          }
          else {
            pDVar8 = this->fNodes;
            index = (ulong)uVar4;
            if (index < pDVar8->nextFreeSlot) {
              pDVar9 = pDVar8->data[index];
              DOMNodeVector::setElementAt(pDVar8,arg,index);
              if (pDVar9 != (DOMNode *)0x0) {
                pDVar10 = &doc->super_DOMNode;
                if (doc == (DOMDocument *)0x0) {
                  pDVar10 = (DOMNode *)0x0;
                }
                plVar5 = (long *)__dynamic_cast(pDVar9,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                                0xfffffffffffffffe);
                if ((plVar5 == (long *)0x0) ||
                   (lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5), lVar6 == 0)) {
                  this_01 = (DOMException *)__cxa_allocate_exception(0x28);
                  DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
                }
                else {
                  lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
                  *(DOMNode **)(lVar6 + 8) = pDVar10;
                  plVar5 = (long *)__dynamic_cast(pDVar9,&DOMNode::typeinfo,
                                                  &HasDOMNodeImpl::typeinfo,0xfffffffffffffffe);
                  if ((plVar5 != (long *)0x0) &&
                     (lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5), lVar6 != 0)) {
                    lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
                    *(ushort *)(lVar6 + 0x10) = *(ushort *)(lVar6 + 0x10) & 0xfff7;
                    return pDVar9;
                  }
                  this_01 = (DOMException *)__cxa_allocate_exception(0x28);
                  DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
                }
                goto LAB_0025b1a9;
              }
            }
            else {
              DOMNodeVector::setElementAt(pDVar8,arg,index);
            }
          }
          return (DOMNode *)0x0;
        }
        this_01 = (DOMException *)__cxa_allocate_exception(0x28);
        ppMVar11 = &XMLPlatformUtils::fgMemoryManager;
        if ((this->fOwnerNode != (DOMNode *)0x0) &&
           (iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_06,iVar3) != 0)
           ) {
          iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
          ppMVar11 = (MemoryManager **)(CONCAT44(extraout_var_07,iVar3) + 0x158);
        }
        DOMException::DOMException(this_01,7,0,*ppMVar11);
      }
      else {
        this_01 = (DOMException *)__cxa_allocate_exception(0x28);
        ppMVar11 = &XMLPlatformUtils::fgMemoryManager;
        if ((this->fOwnerNode != (DOMNode *)0x0) &&
           (iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_04,iVar3) != 0)
           ) {
          iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
          ppMVar11 = (MemoryManager **)(CONCAT44(extraout_var_05,iVar3) + 0x158);
        }
        DOMException::DOMException(this_01,4,0,*ppMVar11);
      }
    }
  }
  else {
    this_01 = (DOMException *)__cxa_allocate_exception(0x28);
    ppMVar11 = &XMLPlatformUtils::fgMemoryManager;
    if ((this->fOwnerNode != (DOMNode *)0x0) &&
       (iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_02,iVar3) != 0)) {
      iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      ppMVar11 = (MemoryManager **)(CONCAT44(extraout_var_03,iVar3) + 0x158);
    }
    DOMException::DOMException(this_01,3,0,*ppMVar11);
  }
LAB_0025b1a9:
  __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMAttrMapImpl::setNamedItem(DOMNode *arg)
{
    if (arg->getNodeType() != DOMNode::ATTRIBUTE_NODE)
        throw DOMException(DOMException::HIERARCHY_REQUEST_ERR, 0, GetDOMNamedNodeMapMemoryManager);

    DOMDocument *doc = fOwnerNode->getOwnerDocument();
    DOMNodeImpl *argImpl = castToNodeImpl(arg);
    if(argImpl->getOwnerDocument() != doc)
        throw DOMException(DOMException::WRONG_DOCUMENT_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    if (this->readOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    if ((arg->getNodeType() == DOMNode::ATTRIBUTE_NODE) && argImpl->isOwned() && (argImpl->fOwnerNode != fOwnerNode))
        throw DOMException(DOMException::INUSE_ATTRIBUTE_ERR,0, GetDOMNamedNodeMapMemoryManager);

    argImpl->fOwnerNode = fOwnerNode;
    argImpl->isOwned(true);
    int i=findNamePoint(arg->getNodeName());
    DOMNode * previous=0;
    if(i>=0)
    {
        previous = fNodes->elementAt(i);
        fNodes->setElementAt(arg,i);
    }
    else
    {
        i=-1-i; // Insert point (may be end of list)
        if(0==fNodes)
        {
            fNodes=new ((DOMDocumentImpl*)doc) DOMNodeVector(doc);
        }
        fNodes->insertElementAt(arg,i);
    }
    if (previous != 0) {
        castToNodeImpl(previous)->fOwnerNode = doc;
        castToNodeImpl(previous)->isOwned(false);
    }

    return previous;
}